

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::quantize_to_int8(Mat *src,Mat *dst,Mat *scale_data,Option *opt)

{
  Layer *pLVar1;
  ModelBinFromMatArray MStack_98;
  ParamDict pd;
  Mat weights [1];
  
  pLVar1 = create_layer(0x39);
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,scale_data->w);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
  weights[0].cstep = 0;
  weights[0].data = (void *)0x0;
  weights[0].refcount._0_4_ = 0;
  weights[0].refcount._4_4_ = 0;
  weights[0].elemsize._0_4_ = 0;
  weights[0]._20_8_ = 0;
  weights[0].allocator = (Allocator *)0x0;
  weights[0].dims = 0;
  weights[0].w = 0;
  weights[0].h = 0;
  weights[0].d = 0;
  weights[0].c = 0;
  Mat::operator=(weights,scale_data);
  ModelBinFromMatArray::ModelBinFromMatArray(&MStack_98,weights);
  (*pLVar1->_vptr_Layer[3])(pLVar1,&MStack_98);
  ModelBinFromMatArray::~ModelBinFromMatArray(&MStack_98);
  (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst,opt);
  (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  Mat::~Mat(weights);
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

void quantize_to_int8(const Mat& src, Mat& dst, const Mat& scale_data, const Option& opt)
{
    Layer* quantize = create_layer(LayerType::Quantize);

    ParamDict pd;
    pd.set(0, scale_data.w);

    quantize->load_param(pd);

    Mat weights[1];
    weights[0] = scale_data;

    quantize->load_model(ModelBinFromMatArray(weights));

    quantize->create_pipeline(opt);

    quantize->forward(src, dst, opt);

    quantize->destroy_pipeline(opt);

    delete quantize;
}